

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Js::AsmJSByteCodeGenerator::DefineLabels(AsmJSByteCodeGenerator *this)

{
  AsmJsByteCodeWriter *this_00;
  FuncInfo *pFVar1;
  Type pPVar2;
  code *pcVar3;
  bool bVar4;
  ByteCodeLabel BVar5;
  undefined4 *puVar6;
  Type *ppPVar7;
  undefined1 local_40 [8];
  Iterator iter;
  
  this_00 = &this->mWriter;
  BVar5 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  pFVar1 = this->mInfo;
  pFVar1->singleExit = BVar5;
  local_40 = (undefined1  [8])&pFVar1->targetStatements;
  iter.list = (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (iter.list == (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    iter.list = (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)
                ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])iter.list == local_40) break;
    ppPVar7 = SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
    pPVar2 = *ppPVar7;
    BVar5 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
    pPVar2->breakLabel = BVar5;
    BVar5 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
    pPVar2->continueLabel = BVar5;
    pPVar2->emitLabels = true;
  }
  return;
}

Assistant:

void AsmJSByteCodeGenerator::DefineLabels()
    {
        mInfo->singleExit=mWriter.DefineLabel();
        SList<ParseNodeStmt *>::Iterator iter(&mInfo->targetStatements);
        while (iter.Next())
        {
            ParseNodeStmt * node = iter.Data();
            node->breakLabel=mWriter.DefineLabel();
            node->continueLabel=mWriter.DefineLabel();
            node->emitLabels=true;
        }
    }